

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O2

bool ApplicativeHelper::isSafe(TermStack *args)

{
  bool bVar1;
  uint uVar2;
  TermList head;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = 0;
  while( true ) {
    uVar4 = (ulong)uVar2;
    uVar3 = (long)args->_cursor - (long)args->_stack >> 3;
    if (uVar3 <= uVar4) break;
    head = getHead((TermList)0x41f397);
    bVar1 = isComb(head);
    if ((bVar1) || (uVar2 = uVar2 + 1, (head._content & 1) != 0)) break;
  }
  return uVar3 <= uVar4;
}

Assistant:

bool ApplicativeHelper::isSafe(TermStack& args)
{
  for(unsigned i = 0; i < args.size(); i++){
    TermList ithArg = args[i];
    /*if(ithArg.isVar() || !ithArg.term()->ground()){
      return false;
    }*/
    TermList head = getHead(ithArg);
    if(isComb(head) || head.isVar()){
      return false;
    }
  }
  return true;
}